

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

string * __thiscall miniros::TransportTCP::getClientURI_abi_cxx11_(TransportTCP *this)

{
  uint16_t uVar1;
  char *__src;
  ostream *poVar2;
  long in_RSI;
  string *in_RDI;
  stringstream uri;
  string ip;
  int port;
  char namebuf [128];
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  socklen_t sas_len;
  sockaddr_storage sas;
  sockaddr *__addr;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  stringstream local_2f0 [16];
  ostream local_2e0 [399];
  allocator<char> local_151;
  string local_150 [32];
  in_addr_t local_130;
  uint local_12c;
  char local_128 [128];
  sockaddr *local_a8;
  sockaddr *local_a0;
  socklen_t local_94;
  sockaddr local_90 [9];
  
  local_94 = 0x80;
  __addr = local_90;
  getpeername(*(int *)(in_RSI + 0x98),__addr,&local_94);
  __s = (char *)0x0;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_128[0x70] = '\0';
  local_128[0x71] = '\0';
  local_128[0x72] = '\0';
  local_128[0x73] = '\0';
  local_128[0x74] = '\0';
  local_128[0x75] = '\0';
  local_128[0x76] = '\0';
  local_128[0x77] = '\0';
  local_128[0x78] = '\0';
  local_128[0x79] = '\0';
  local_128[0x7a] = '\0';
  local_128[0x7b] = '\0';
  local_128[0x7c] = '\0';
  local_128[0x7d] = '\0';
  local_128[0x7e] = '\0';
  local_128[0x7f] = '\0';
  local_128[0x60] = '\0';
  local_128[0x61] = '\0';
  local_128[0x62] = '\0';
  local_128[99] = '\0';
  local_128[100] = '\0';
  local_128[0x65] = '\0';
  local_128[0x66] = '\0';
  local_128[0x67] = '\0';
  local_128[0x68] = '\0';
  local_128[0x69] = '\0';
  local_128[0x6a] = '\0';
  local_128[0x6b] = '\0';
  local_128[0x6c] = '\0';
  local_128[0x6d] = '\0';
  local_128[0x6e] = '\0';
  local_128[0x6f] = '\0';
  local_128[0x50] = '\0';
  local_128[0x51] = '\0';
  local_128[0x52] = '\0';
  local_128[0x53] = '\0';
  local_128[0x54] = '\0';
  local_128[0x55] = '\0';
  local_128[0x56] = '\0';
  local_128[0x57] = '\0';
  local_128[0x58] = '\0';
  local_128[0x59] = '\0';
  local_128[0x5a] = '\0';
  local_128[0x5b] = '\0';
  local_128[0x5c] = '\0';
  local_128[0x5d] = '\0';
  local_128[0x5e] = '\0';
  local_128[0x5f] = '\0';
  local_128[0x40] = '\0';
  local_128[0x41] = '\0';
  local_128[0x42] = '\0';
  local_128[0x43] = '\0';
  local_128[0x44] = '\0';
  local_128[0x45] = '\0';
  local_128[0x46] = '\0';
  local_128[0x47] = '\0';
  local_128[0x48] = '\0';
  local_128[0x49] = '\0';
  local_128[0x4a] = '\0';
  local_128[0x4b] = '\0';
  local_128[0x4c] = '\0';
  local_128[0x4d] = '\0';
  local_128[0x4e] = '\0';
  local_128[0x4f] = '\0';
  local_128[0x30] = '\0';
  local_128[0x31] = '\0';
  local_128[0x32] = '\0';
  local_128[0x33] = '\0';
  local_128[0x34] = '\0';
  local_128[0x35] = '\0';
  local_128[0x36] = '\0';
  local_128[0x37] = '\0';
  local_128[0x38] = '\0';
  local_128[0x39] = '\0';
  local_128[0x3a] = '\0';
  local_128[0x3b] = '\0';
  local_128[0x3c] = '\0';
  local_128[0x3d] = '\0';
  local_128[0x3e] = '\0';
  local_128[0x3f] = '\0';
  local_128[0x20] = '\0';
  local_128[0x21] = '\0';
  local_128[0x22] = '\0';
  local_128[0x23] = '\0';
  local_128[0x24] = '\0';
  local_128[0x25] = '\0';
  local_128[0x26] = '\0';
  local_128[0x27] = '\0';
  local_128[0x28] = '\0';
  local_128[0x29] = '\0';
  local_128[0x2a] = '\0';
  local_128[0x2b] = '\0';
  local_128[0x2c] = '\0';
  local_128[0x2d] = '\0';
  local_128[0x2e] = '\0';
  local_128[0x2f] = '\0';
  local_128[0x10] = '\0';
  local_128[0x11] = '\0';
  local_128[0x12] = '\0';
  local_128[0x13] = '\0';
  local_128[0x14] = '\0';
  local_128[0x15] = '\0';
  local_128[0x16] = '\0';
  local_128[0x17] = '\0';
  local_128[0x18] = '\0';
  local_128[0x19] = '\0';
  local_128[0x1a] = '\0';
  local_128[0x1b] = '\0';
  local_128[0x1c] = '\0';
  local_128[0x1d] = '\0';
  local_128[0x1e] = '\0';
  local_128[0x1f] = '\0';
  local_128[0] = '\0';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_128[4] = '\0';
  local_128[5] = '\0';
  local_128[6] = '\0';
  local_128[7] = '\0';
  local_128[8] = '\0';
  local_128[9] = '\0';
  local_128[10] = '\0';
  local_128[0xb] = '\0';
  local_128[0xc] = '\0';
  local_128[0xd] = '\0';
  local_128[0xe] = '\0';
  local_128[0xf] = '\0';
  local_a8 = __addr;
  local_a0 = __addr;
  if (local_90[0].sa_family == 2) {
    uVar1 = ntohs(*(uint16_t *)__addr->sa_data);
    local_12c = (uint)uVar1;
    local_130 = *(in_addr_t *)(local_a0->sa_data + 2);
    __src = inet_ntoa((in_addr)local_130);
    strncpy(local_128,__src,0x7f);
  }
  else if (local_90[0].sa_family == 10) {
    uVar1 = ntohs(*(uint16_t *)__addr->sa_data);
    local_12c = (uint)uVar1;
    inet_ntop(10,local_a8->sa_data + 6,local_128,0x80);
  }
  else {
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_12c = 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,(allocator<char> *)__addr);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::stringstream::stringstream(local_2f0);
  poVar2 = std::operator<<(local_2e0,local_150);
  poVar2 = std::operator<<(poVar2,":");
  std::ostream::operator<<(poVar2,local_12c);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_2f0);
  std::__cxx11::string::~string(local_150);
  return in_RDI;
}

Assistant:

std::string TransportTCP::getClientURI()
{
  MINIROS_ASSERT(!is_server_);

  sockaddr_storage sas;
  socklen_t sas_len = sizeof(sas);
  getpeername(sock_, (sockaddr *)&sas, &sas_len);
  
  sockaddr_in *sin = (sockaddr_in *)&sas;
  sockaddr_in6 *sin6 = (sockaddr_in6 *)&sas;

  char namebuf[128] = {};
  int port;

  switch (sas.ss_family)
  {
    case AF_INET:
      port = ntohs(sin->sin_port);
      strncpy(namebuf, inet_ntoa(sin->sin_addr), sizeof(namebuf)-1);
      break;
    case AF_INET6:
      port = ntohs(sin6->sin6_port);
      inet_ntop(AF_INET6, (void*)&(sin6->sin6_addr), namebuf, sizeof(namebuf));
      break;
    default:
      namebuf[0] = 0;
      port = 0;
      break;
  }

  std::string ip = namebuf;
  std::stringstream uri;
  uri << ip << ":" << port;

  return uri.str();
}